

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

void __thiscall elem::destroy(elem *this)

{
  __cilkrts_hyperobject_base *p_Var1;
  cilk_c_reducer_deallocate_fn_t p_Var2;
  
  if (this->key != this->view) {
    p_Var1 = this->hb;
    p_Var2 = (p_Var1->__c_monoid).deallocate_fn;
    (*(p_Var1->__c_monoid).destroy_fn)(p_Var1,this->view);
    (*p_Var2)(this->hb,this->view);
  }
  this->view = (void *)0x0;
  return;
}

Assistant:

void elem::destroy()
{
    if (! is_leftmost()) {

        // Call destroy_fn and deallocate_fn on the view, but not if it's the
        // leftmost view.
        cilk_c_monoid *monoid = &(hb->__c_monoid);
        cilk_c_reducer_destroy_fn_t    destroy_fn    = monoid->destroy_fn;
        cilk_c_reducer_deallocate_fn_t deallocate_fn = monoid->deallocate_fn;
	
        destroy_fn((void*)hb, view);
        deallocate_fn((void*)hb, view);
    }

    view = 0;
}